

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmultiphysicscompel.cpp
# Opt level: O0

void __thiscall
TPZMultiphysicsCompEl<pzgeom::TPZGeoCube>::InitMaterialDataT<double>
          (TPZMultiphysicsCompEl<pzgeom::TPZGeoCube> *this,
          map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
          *dataVec,TPZVec<long> *indices)

{
  bool bVar1;
  long *plVar2;
  TPZCompElSide *pTVar3;
  TPZGeoEl *this_00;
  int64_t iVar4;
  TPZCompEl *pTVar5;
  mapped_type *pmVar6;
  reference ppVar7;
  int *piVar8;
  long lVar9;
  TPZVec<long> *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  TPZMatCombinedSpacesT<double> *mat;
  pair<const_int,_TPZMaterialDataT<double>_> *it;
  iterator __end0;
  iterator __begin0;
  map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
  *__range2;
  int n_active_approx_spaces;
  TPZInterpolationSpace *msp_1;
  int64_t iref_1;
  TPZVec<int> nshape_1;
  TPZInterpolationSpace *msp;
  int64_t indiciref;
  int64_t iref;
  TPZVec<int> nshape;
  int64_t nindices;
  int64_t nref;
  map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
  *in_stack_fffffffffffffe88;
  TPZVec<int> *in_stack_fffffffffffffe90;
  TPZCompEl *in_stack_fffffffffffffe98;
  TPZCompEl *local_158;
  mapped_type *in_stack_fffffffffffffec0;
  TPZGeoEl *in_stack_fffffffffffffec8;
  TPZManVector<int,_5> *in_stack_fffffffffffffed0;
  TPZManVector<int,_5> *local_120;
  _Self local_d8;
  _Self local_d0;
  undefined8 local_c8;
  undefined4 local_bc;
  int local_b8;
  undefined4 local_b4;
  TPZCompEl *local_b0;
  undefined4 local_a4;
  int64_t local_a0;
  undefined4 local_74;
  TPZManVector<int,_5> *local_70;
  undefined4 local_68;
  int64_t local_58;
  long local_50;
  int64_t local_28;
  int64_t local_20;
  TPZVec<long> *local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_20 = TPZVec<TPZCompElSide>::size((TPZVec<TPZCompElSide> *)(in_RDI + 0xf));
  if (local_18 == (TPZVec<long> *)0x0) {
    TPZVec<int>::TPZVec(in_stack_fffffffffffffe90,(int64_t)in_stack_fffffffffffffe88);
    for (local_a0 = 0; local_a0 < local_20; local_a0 = local_a0 + 1) {
      pTVar3 = TPZVec<TPZCompElSide>::operator[]((TPZVec<TPZCompElSide> *)(in_RDI + 0xf),local_a0);
      bVar1 = TPZCompElSide::operator_cast_to_bool(pTVar3);
      if (bVar1) {
        pTVar3 = TPZVec<TPZCompElSide>::operator[]((TPZVec<TPZCompElSide> *)(in_RDI + 0xf),local_a0)
        ;
        TPZCompElSide::Element(pTVar3);
        in_stack_fffffffffffffec8 = TPZCompEl::Reference(in_stack_fffffffffffffe98);
        iVar4 = TPZGeoEl::Id(in_stack_fffffffffffffec8);
        local_a4 = (undefined4)local_a0;
        in_stack_fffffffffffffec0 =
             std::
             map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
             ::operator[]((map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
                           *)in_stack_fffffffffffffed0,(key_type *)in_stack_fffffffffffffec8);
        (in_stack_fffffffffffffec0->super_TPZMaterialData).gelElId = (int)iVar4;
      }
      pTVar3 = TPZVec<TPZCompElSide>::operator[]((TPZVec<TPZCompElSide> *)(in_RDI + 0xf),local_a0);
      pTVar5 = TPZCompElSide::Element(pTVar3);
      if (pTVar5 == (TPZCompEl *)0x0) {
        local_158 = (TPZCompEl *)0x0;
      }
      else {
        local_158 = (TPZCompEl *)
                    __dynamic_cast(pTVar5,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo,0);
      }
      local_b0 = local_158;
      if (local_158 != (TPZCompEl *)0x0) {
        local_b4 = (undefined4)local_a0;
        pmVar6 = std::
                 map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
                 ::operator[]((map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
                               *)in_stack_fffffffffffffed0,(key_type *)in_stack_fffffffffffffec8);
        (**(code **)(*(long *)local_158 + 0x298))(local_158,pmVar6);
        in_stack_fffffffffffffe98 = local_158;
      }
    }
    TPZVec<int>::~TPZVec(in_stack_fffffffffffffe90);
  }
  else {
    local_28 = TPZVec<long>::size(local_18);
    TPZVec<int>::TPZVec(in_stack_fffffffffffffe90,(int64_t)in_stack_fffffffffffffe88);
    for (local_50 = 0; local_50 < local_28; local_50 = local_50 + 1) {
      plVar2 = TPZVec<long>::operator[](local_18,local_50);
      local_58 = *plVar2;
      pTVar3 = TPZVec<TPZCompElSide>::operator[]((TPZVec<TPZCompElSide> *)(in_RDI + 0xf),local_58);
      bVar1 = TPZCompElSide::operator_cast_to_bool(pTVar3);
      if (bVar1) {
        pTVar3 = TPZVec<TPZCompElSide>::operator[]((TPZVec<TPZCompElSide> *)(in_RDI + 0xf),local_58)
        ;
        TPZCompElSide::Element(pTVar3);
        this_00 = TPZCompEl::Reference(in_stack_fffffffffffffe98);
        iVar4 = TPZGeoEl::Id(this_00);
        local_68 = (undefined4)local_58;
        pmVar6 = std::
                 map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
                 ::operator[]((map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
                               *)in_stack_fffffffffffffed0,(key_type *)in_stack_fffffffffffffec8);
        (pmVar6->super_TPZMaterialData).gelElId = (int)iVar4;
      }
      pTVar3 = TPZVec<TPZCompElSide>::operator[]((TPZVec<TPZCompElSide> *)(in_RDI + 0xf),local_58);
      pTVar5 = TPZCompElSide::Element(pTVar3);
      if (pTVar5 == (TPZCompEl *)0x0) {
        local_120 = (TPZManVector<int,_5> *)0x0;
      }
      else {
        local_120 = (TPZManVector<int,_5> *)
                    __dynamic_cast(pTVar5,&TPZCompEl::typeinfo,&TPZInterpolationSpace::typeinfo,0);
      }
      local_70 = local_120;
      if (local_120 != (TPZManVector<int,_5> *)0x0) {
        local_74 = (undefined4)local_58;
        pmVar6 = std::
                 map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
                 ::operator[]((map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
                               *)local_120,(key_type *)in_stack_fffffffffffffec8);
        (**(code **)(*(long *)&((_Rep_type *)&local_120->super_TPZVec<int>)->_M_impl + 0x298))
                  (local_120,pmVar6);
        in_stack_fffffffffffffed0 = local_120;
      }
    }
    TPZVec<int>::~TPZVec(in_stack_fffffffffffffe90);
  }
  iVar4 = TPZVec<int>::size((TPZVec<int> *)(in_RDI + 8));
  local_b8 = (int)iVar4;
  if (local_b8 == 0) {
    local_bc = 1;
    TPZManVector<int,_5>::Resize
              (in_stack_fffffffffffffed0,(int64_t)in_stack_fffffffffffffec8,
               (int *)in_stack_fffffffffffffec0);
  }
  local_c8 = local_10;
  local_d0._M_node =
       (_Base_ptr)
       std::
       map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
       ::begin(in_stack_fffffffffffffe88);
  local_d8._M_node =
       (_Base_ptr)
       std::
       map<int,_TPZMaterialDataT<double>,_std::less<int>,_std::allocator<std::pair<const_int,_TPZMaterialDataT<double>_>_>_>
       ::end(in_stack_fffffffffffffe88);
  while (bVar1 = std::operator!=(&local_d0,&local_d8), bVar1) {
    ppVar7 = std::_Rb_tree_iterator<std::pair<const_int,_TPZMaterialDataT<double>_>_>::operator*
                       ((_Rb_tree_iterator<std::pair<const_int,_TPZMaterialDataT<double>_>_> *)
                        in_stack_fffffffffffffe90);
    piVar8 = TPZVec<int>::operator[]((TPZVec<int> *)(in_RDI + 8),(long)ppVar7->first);
    (ppVar7->second).super_TPZMaterialData.fActiveApproxSpace = *piVar8 != 0;
    std::_Rb_tree_iterator<std::pair<const_int,_TPZMaterialDataT<double>_>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_TPZMaterialDataT<double>_>_> *)
               in_stack_fffffffffffffe90);
  }
  lVar9 = (**(code **)(*in_RDI + 0xb8))();
  if (lVar9 == 0) {
    plVar2 = (long *)0x0;
  }
  else {
    plVar2 = (long *)__dynamic_cast(lVar9,&TPZMaterial::typeinfo,
                                    &TPZMatCombinedSpacesT<double>::typeinfo,0xfffffffffffffffe);
  }
  (**(code **)(*plVar2 + 0x58))(plVar2,local_10);
  return;
}

Assistant:

void TPZMultiphysicsCompEl<TGeometry>::InitMaterialDataT(std::map<int, TPZMaterialDataT<TVar> > &dataVec, TPZVec<int64_t> *indices)
{
    int64_t nref = this->fElementVec.size();
    
//#ifdef PZDEBUG
//    if (nref != dataVec.size()) {
//        PZError << "Error at " << __PRETTY_FUNCTION__ << " The number of materials can not be different from the size of the fElementVec !\n";
//        DebugStop();
//    }
//#endif
    if(indices){
        int64_t nindices = indices->size();
        TPZVec<int> nshape(nindices);
        for (int64_t iref = 0; iref <nindices; iref++) {
            int64_t indiciref = indices->operator[](iref);
            if(fElementVec[indiciref])
            {
                dataVec[indiciref].gelElId = fElementVec[indiciref].Element()->Reference()->Id();
            }
            TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[indiciref].Element());
            if (!msp) {
                continue;
            }
            // precisa comentar essa parte se for calcular os vetores no pontos de integracao.
            msp->InitMaterialData(dataVec[indiciref]);
        }
    }else{
        TPZVec<int> nshape(nref);
        for (int64_t iref = 0; iref < nref; iref++)
        {
            if(fElementVec[iref])
            {
                dataVec[iref].gelElId = fElementVec[iref].Element()->Reference()->Id();
            }
            TPZInterpolationSpace *msp  = dynamic_cast <TPZInterpolationSpace *>(fElementVec[iref].Element());
            if (!msp) {
                continue;
            }
            // precisa comentar essa parte se for calcular os vetores no pontos de integracao.
            msp->InitMaterialData(dataVec[iref]);
        }
    }
    
    int n_active_approx_spaces = fActiveApproxSpace.size();
    if (n_active_approx_spaces == 0) { /// it preserves the integrity for old version of multiphycis codes.
        fActiveApproxSpace.Resize(nref, 1);
    }
    
    for (auto &it : dataVec) {
        it.second.fActiveApproxSpace = fActiveApproxSpace[it.first];
    }
    auto * mat =
        dynamic_cast<TPZMatCombinedSpacesT<TVar>*>(this->Material());
    mat->FillDataRequirements(dataVec);
    
}